

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O3

ssl_private_key_result_t
AsyncPrivateKeyDecrypt
          (SSL *ssl,uint8_t *out,size_t *out_len,size_t max_out,uint8_t *in,size_t in_len)

{
  uint uVar1;
  int iVar2;
  ssl_private_key_result_t sVar3;
  TestState *pTVar4;
  SSL *ssl_00;
  RSA *rsa;
  void *pvVar5;
  pointer puVar6;
  SSL_CREDENTIAL *cred;
  UniquePtr<EVP_PKEY> *pUVar7;
  size_t sVar8;
  size_t *extraout_RDX;
  size_t __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uint8_t *puVar9;
  pointer __src;
  SSL *ssl_01;
  
  sVar8 = max_out;
  puVar9 = out;
  ssl_00 = (SSL *)ssl;
  pTVar4 = GetTestState(ssl);
  pTVar4->used_private_key = true;
  if ((pTVar4->private_key_result).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pTVar4->private_key_result).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ssl_00 = (SSL *)GetPrivateKey(ssl);
    rsa = EVP_PKEY_get0_RSA((EVP_PKEY *)ssl_00);
    if (rsa != (RSA *)0x0) {
      this = &pTVar4->private_key_result;
      uVar1 = RSA_size((RSA *)rsa);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,(ulong)uVar1);
      puVar9 = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = RSA_size((RSA *)rsa);
      iVar2 = RSA_decrypt(rsa,out_len,puVar9,(ulong)uVar1,in,in_len,3);
      if (iVar2 != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,*out_len);
        sVar3 = AsyncPrivateKeyComplete(ssl,out,out_len,max_out);
        return sVar3;
      }
      return ssl_private_key_failure;
    }
  }
  else {
    AsyncPrivateKeyDecrypt();
  }
  AsyncPrivateKeyDecrypt();
  ssl_01 = ssl_00;
  pTVar4 = GetTestState((SSL *)ssl_00);
  if ((pTVar4->private_key_result).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pTVar4->private_key_result).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar2 = TestConfigExDataIndex();
    pvVar5 = SSL_get_ex_data(ssl_00,iVar2);
    if ((*(char *)((long)pvVar5 + 0x269) != '\x01') ||
       (sVar3 = ssl_private_key_retry, 1 < pTVar4->private_key_retries)) {
      __src = (pTVar4->private_key_result).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
      puVar6 = (pTVar4->private_key_result).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      __n = (long)puVar6 - (long)__src;
      if (sVar8 < __n) {
        AsyncPrivateKeyComplete();
        sVar3 = ssl_private_key_failure;
      }
      else {
        if (puVar6 != __src) {
          memcpy(puVar9,__src,__n);
          __src = (pTVar4->private_key_result).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
          puVar6 = (pTVar4->private_key_result).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          __n = (long)puVar6 - (long)__src;
        }
        *extraout_RDX = __n;
        if (puVar6 != __src) {
          (pTVar4->private_key_result).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = __src;
        }
        pTVar4->private_key_retries = 0;
        sVar3 = ssl_private_key_success;
      }
    }
    return sVar3;
  }
  AsyncPrivateKeyComplete();
  cred = SSL_get0_selected_credential((SSL *)ssl_01);
  iVar2 = CredentialInfoExDataIndex();
  pvVar5 = SSL_CREDENTIAL_get_ex_data(cred,iVar2);
  if (pvVar5 == (void *)0x0) {
    pTVar4 = GetTestState((SSL *)ssl_01);
    pUVar7 = &pTVar4->private_key;
  }
  else {
    pUVar7 = (UniquePtr<EVP_PKEY> *)((long)pvVar5 + 8);
  }
  return (ssl_private_key_result_t)
         (pUVar7->_M_t).super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
}

Assistant:

static ssl_private_key_result_t AsyncPrivateKeyDecrypt(SSL *ssl, uint8_t *out,
                                                       size_t *out_len,
                                                       size_t max_out,
                                                       const uint8_t *in,
                                                       size_t in_len) {
  TestState *test_state = GetTestState(ssl);
  test_state->used_private_key = true;
  if (!test_state->private_key_result.empty()) {
    fprintf(stderr, "AsyncPrivateKeyDecrypt called with operation pending.\n");
    abort();
  }

  EVP_PKEY *private_key = GetPrivateKey(ssl);
  RSA *rsa = EVP_PKEY_get0_RSA(private_key);
  if (rsa == NULL) {
    fprintf(stderr, "AsyncPrivateKeyDecrypt called with incorrect key type.\n");
    abort();
  }
  test_state->private_key_result.resize(RSA_size(rsa));
  if (!RSA_decrypt(rsa, out_len, test_state->private_key_result.data(),
                   RSA_size(rsa), in, in_len, RSA_NO_PADDING)) {
    return ssl_private_key_failure;
  }

  test_state->private_key_result.resize(*out_len);

  return AsyncPrivateKeyComplete(ssl, out, out_len, max_out);
}